

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrature.hpp
# Opt level: O1

void __thiscall
IntegratorXX::Quadrature<IntegratorXX::Delley<double>>::Quadrature<unsigned_long&,void>
          (Quadrature<IntegratorXX::Delley<double>> *this,unsigned_long *args)

{
  tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_48;
  
  quadrature_traits<IntegratorXX::Delley<double>,_void>::generate(&local_48,*args);
  *(pointer *)this =
       local_48.
       super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
       .
       super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
       ._M_head_impl.
       super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(this + 8) =
       local_48.
       super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
       .
       super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
       ._M_head_impl.
       super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x10) =
       local_48.
       super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
       .
       super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
       ._M_head_impl.
       super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .
  super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
  ._M_head_impl.
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .
  super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
  ._M_head_impl.
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .
  super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
  ._M_head_impl.
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)(this + 0x18) =
       local_48.
       super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
       .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
       super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x20) =
       local_48.
       super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
       .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
       super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  *(pointer *)(this + 0x28) =
       local_48.
       super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
       .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
       super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.
  super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
  super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.
  super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
  super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.
  super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
  super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ::sanity_check((QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                  *)this);
  if (local_48.
      super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
      .
      super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
      ._M_head_impl.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                    .
                    super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
      .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
      super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_48.
                    super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                    .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                    super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
                    _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                          super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                          ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                          super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                          ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Quadrature( Args&&... args ) :
    Quadrature( generate( std::forward<Args>(args)... ) ) { }